

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O1

void __thiscall adios2::utils::Reorganize::ParseArguments(Reorganize *this)

{
  _Rb_tree_header *p_Var1;
  Reorganize *in_RSI;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  parseParams((Params *)&local_40,in_RSI,&this->rmethodparam_str);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->rmethodparams)._M_t);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_40._M_impl.super__Rb_tree_header;
    in_RSI = (Reorganize *)(ulong)local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  parseParams((Params *)&local_40,in_RSI,&this->wmethodparam_str);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->wmethodparams)._M_t);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_40._M_impl.super__Rb_tree_header;
    (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void Reorganize::ParseArguments()
{
    rmethodparams = parseParams(rmethodparam_str);
    wmethodparams = parseParams(wmethodparam_str);
}